

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase441::run(TestCase441 *this)

{
  Builder builder_00;
  Reader reader;
  Reader reader_00;
  Builder root;
  undefined1 in_stack_00000070 [16];
  undefined1 in_stack_00000080 [24];
  undefined1 in_stack_00000098 [24];
  MallocMessageBuilder builder;
  StructBuilder local_1b8;
  Builder local_190 [5];
  PointerBuilder local_118;
  PointerBuilder local_f8;
  StructBuilder in_stack_ffffffffffffff20;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&local_f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(local_190,(MessageBuilder *)&local_f8);
  local_118.pointer = local_190[0].builder.pointer;
  local_118.segment = local_190[0].builder.segment;
  local_118.capTable = local_190[0].builder.capTable;
  PointerBuilder::getStruct(&local_1b8,&local_118,(StructSize)0x10000,(word *)0x0);
  initTestMessage((Builder)in_stack_ffffffffffffff20);
  StructBuilder::asReader(&local_1b8);
  reader._reader._24_24_ = in_stack_00000098;
  reader._reader._0_24_ = in_stack_00000080;
  checkTestMessage(reader);
  builder_00._builder._16_24_ = in_stack_00000080;
  builder_00._builder._0_16_ = in_stack_00000070;
  checkTestMessage(builder_00);
  StructBuilder::asReader(&local_1b8);
  reader_00._reader._24_24_ = in_stack_00000098;
  reader_00._reader._0_24_ = in_stack_00000080;
  checkTestMessage(reader_00);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&local_f8);
  return;
}

Assistant:

TEST(Encoding, BuildListDefaults) {
  MallocMessageBuilder builder;
  TestListDefaults::Builder root = builder.getRoot<TestListDefaults>();

  initTestMessage(root);
  checkTestMessage(root.asReader());
  checkTestMessage(root);
  checkTestMessage(root.asReader());
}